

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::ReportCounts
          (BasicReporter *this,string *label,Counts *counts,string *allPrefix)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  string *in_RCX;
  Counts *in_RDX;
  string *in_RSI;
  long in_RDI;
  pluralise *in_stack_ffffffffffffff48;
  pluralise *in_stack_ffffffffffffff50;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  Counts *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  if (in_RDX->passed == 0) {
    local_20 = in_RCX;
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    bVar1 = local_18->failed < 2;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
    }
    else {
      std::__cxx11::string::string(local_40,local_20);
    }
    std::operator<<(poVar2,local_40);
    pluralise::pluralise
              (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,(string *)0x1ea619);
    poVar2 = operator<<((ostream *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::operator<<(poVar2," failed");
    pluralise::~pluralise((pluralise *)0x1ea64e);
    std::__cxx11::string::~string(local_40);
    if (bVar1) {
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  else {
    local_10 = in_RSI;
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18->failed);
    poVar2 = std::operator<<(poVar2," of ");
    sVar3 = Counts::total(local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2,"s failed");
  }
  return;
}

Assistant:

void ReportCounts( const std::string& label, const Counts& counts, const std::string& allPrefix = "All " ) {
            if( counts.passed )
                m_config.stream() << counts.failed << " of " << counts.total() << " " << label << "s failed";
            else
                m_config.stream() << ( counts.failed > 1 ? allPrefix : "" ) << pluralise( counts.failed, label ) << " failed";
        }